

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O1

void __thiscall
Rml::FontEffectGlow::GenerateGlyphTexture
          (FontEffectGlow *this,byte *destination_data,Vector2i destination_dimensions,
          int destination_stride,FontGlyph *glyph)

{
  BasicStackAllocator *pBVar1;
  size_t byte_size;
  Vector2i source_offset;
  int destination_stride_00;
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> blur_x_output;
  DynamicArray<unsigned_char,_Rml::GlobalStackAllocator<unsigned_char>_> outline_output;
  
  destination_stride_00 = destination_dimensions.x;
  byte_size = (size_t)(destination_dimensions.y * destination_stride_00);
  outline_output.N = byte_size;
  pBVar1 = Detail::GetGlobalBasicStackAllocator();
  outline_output.p = (uchar *)Detail::BasicStackAllocator::allocate(pBVar1,1,byte_size);
  blur_x_output.N = byte_size;
  pBVar1 = Detail::GetGlobalBasicStackAllocator();
  blur_x_output.p = (uchar *)Detail::BasicStackAllocator::allocate(pBVar1,1,byte_size);
  source_offset.y = this->combined_width;
  source_offset.x = this->combined_width;
  ConvolutionFilter::Run
            (&this->filter_outline,outline_output.p,destination_dimensions,destination_stride_00,A8,
             glyph->bitmap_data,glyph->bitmap_dimensions,source_offset,glyph->color_format);
  ConvolutionFilter::Run
            (&this->filter_blur_x,blur_x_output.p,destination_dimensions,destination_stride_00,A8,
             outline_output.p,destination_dimensions,(Vector2i)0x0,A8);
  ConvolutionFilter::Run
            (&this->filter_blur_y,destination_data,destination_dimensions,destination_stride,RGBA8,
             blur_x_output.p,destination_dimensions,(Vector2i)0x0,A8);
  FontEffect::FillColorValuesFromAlpha(destination_data,destination_dimensions,destination_stride);
  GlobalStackAllocator<unsigned_char>::deallocate
            ((GlobalStackAllocator<unsigned_char> *)&blur_x_output,blur_x_output.p,blur_x_output.N);
  GlobalStackAllocator<unsigned_char>::deallocate
            ((GlobalStackAllocator<unsigned_char> *)&outline_output,outline_output.p,
             outline_output.N);
  return;
}

Assistant:

void FontEffectGlow::GenerateGlyphTexture(byte* destination_data, const Vector2i destination_dimensions, int destination_stride,
	const FontGlyph& glyph) const
{
	const Vector2i buf_dimensions = destination_dimensions;
	const int buf_stride = buf_dimensions.x;
	const int buf_size = buf_dimensions.x * buf_dimensions.y;

	DynamicArray<byte, GlobalStackAllocator<byte>> outline_output(buf_size);
	DynamicArray<byte, GlobalStackAllocator<byte>> blur_x_output(buf_size);

	filter_outline.Run(outline_output.data(), buf_dimensions, buf_stride, ColorFormat::A8, glyph.bitmap_data, glyph.bitmap_dimensions,
		Vector2i(combined_width), glyph.color_format);

	filter_blur_x.Run(blur_x_output.data(), buf_dimensions, buf_stride, ColorFormat::A8, outline_output.data(), buf_dimensions, Vector2i(0),
		ColorFormat::A8);

	filter_blur_y.Run(destination_data, destination_dimensions, destination_stride, ColorFormat::RGBA8, blur_x_output.data(), buf_dimensions,
		Vector2i(0), ColorFormat::A8);

	FillColorValuesFromAlpha(destination_data, destination_dimensions, destination_stride);
}